

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compression.cpp
# Opt level: O3

void pixels::compareExact(uint32_t a,uint32_t b,int x,int y,char *taga,char *tagb,char *chan)

{
  long lVar1;
  ostream *poVar2;
  size_t sVar3;
  char *func;
  
  if (a == b) {
    return;
  }
  if (chan == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x1985a0);
  }
  else {
    sVar3 = strlen(chan);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,chan,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," uint at ",9);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,", ",2);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," not equal: ",0xc);
  if (taga == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(taga);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,taga,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," 0x",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," vs ",4);
  if (tagb == (char *)0x0) {
    std::ios::clear((int)poVar2 + (int)*(undefined8 *)(*(long *)poVar2 + -0x18));
  }
  else {
    sVar3 = strlen(tagb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2,tagb,sVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," 0x",3);
  *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
       *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  lVar1 = *(long *)poVar2;
  func = *(char **)(lVar1 + -0x18);
  *(uint *)(poVar2 + 0x18 + (long)func) = *(uint *)(poVar2 + 0x18 + (long)func) & 0xffffffb5 | 2;
  std::ios::widen((char)*(undefined8 *)(lVar1 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  core_test_fail("a == b",(char *)0x1ed,0x17a6c9,func);
}

Assistant:

static inline void compareExact (
        uint32_t    a,
        uint32_t    b,
        int         x,
        int         y,
        const char* taga,
        const char* tagb,
        const char* chan)
    {
        if (a != b)
        {
            std::cout << chan << " uint at " << x << ", " << y
                      << " not equal: " << taga << " 0x" << std::hex << a
                      << std::dec << " vs " << tagb << " 0x" << std::hex << b
                      << std::dec << std::endl;
        }
        EXRCORE_TEST (a == b);
    }